

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo(nk_context *ctx,char **items,int count,int selected,int item_height,nk_vec2 size)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  nk_vec2 ctx_00;
  nk_vec2 window_padding;
  nk_vec2 item_spacing;
  int max_height;
  int i;
  int in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  nk_vec2 size_00;
  int local_30;
  int local_28;
  float fStack_8;
  int local_4;
  
  local_4 = in_ECX;
  if (((in_RDI != 0) && (in_RSI != 0)) && (in_EDX != 0)) {
    size_00 = *(nk_vec2 *)(in_RDI + 0x1e70);
    ctx_00 = nk_panel_get_padding
                       ((nk_style *)(in_RDI + 0x150),
                        **(nk_panel_type **)(*(long *)(in_RDI + 0x3fc8) + 0xa0));
    iVar1 = (int)size_00.y * 2 + (int)ctx_00.y * 2 + in_EDX * in_R8D + in_EDX * (int)size_00.y;
    fStack_8 = (float)((ulong)in_XMM0_Qa >> 0x20);
    if ((float)iVar1 <= fStack_8) {
      fStack_8 = (float)iVar1;
    }
    iVar1 = nk_combo_begin_label((nk_context *)ctx_00,(char *)ctx_00,size_00);
    local_28 = in_ECX;
    if (iVar1 != 0) {
      nk_layout_row_dynamic
                ((nk_context *)CONCAT44(fStack_8,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
        iVar1 = nk_combo_item_label((nk_context *)CONCAT44(fStack_8,in_stack_ffffffffffffffa0),
                                    (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                     in_stack_ffffffffffffff98),0);
        if (iVar1 != 0) {
          local_28 = local_30;
        }
      }
      nk_combo_end((nk_context *)0x1305d6);
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

NK_API int
nk_combo(struct nk_context *ctx, const char **items, int count,
    int selected, int item_height, struct nk_vec2 size)
{
    int i = 0;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(items);
    NK_ASSERT(ctx->current);
    if (!ctx || !items ||!count)
        return selected;

    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);
    if (nk_combo_begin_label(ctx, items[selected], size)) {
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            if (nk_combo_item_label(ctx, items[i], NK_TEXT_LEFT))
                selected = i;
        }
        nk_combo_end(ctx);
    }
    return selected;
}